

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

string * __thiscall Schedule::info_abi_cxx11_(string *__return_storage_ptr__,Schedule *this)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  analyze(this);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"peak memory: ");
  prettyBytes_abi_cxx11_(&sStack_1c8,this->peak_memory);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1c8);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)&sStack_1c8);
  poVar1 = std::operator<<(local_198,"total time: ");
  prettyNanoseconds_abi_cxx11_(&sStack_1c8,this->total_time);
  std::operator<<(poVar1,(string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string info() {
        analyze();
        std::stringstream ss;
        ss << "peak memory: " << prettyBytes(peak_memory) << ", ";
        ss << "total time: " << prettyNanoseconds(total_time);
        return ss.str();
    }